

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O0

int PHF::init<std::__cxx11::string,true>
              (phf *phf,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k,
              size_t n,size_t l,size_t a,phf_seed_t seed)

{
  uint32_t uVar1;
  int *piVar2;
  bool bVar3;
  uint32_t local_1f8;
  ulong local_1a8;
  size_t local_198;
  size_t local_190;
  ulong local_188;
  ulong local_180;
  ulong local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  uint local_10c;
  uint32_t uStack_108;
  uint32_t f;
  size_t d;
  phf_key<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *Bi_pe;
  phf_key<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *Bi_p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  uint local_bc;
  ulong uStack_b8;
  phf_hash_t g_1;
  size_t i;
  int error;
  uint32_t d_max;
  uint32_t *g;
  size_t T_n;
  phf_bits_t *T_b;
  phf_bits_t *T;
  phf_key<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *B_pe;
  phf_key<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *B_p;
  size_t *B_z;
  phf_key<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *B_k;
  size_t m;
  size_t r;
  size_t a1;
  size_t l1;
  size_t n1;
  size_t sStack_38;
  phf_seed_t seed_local;
  size_t a_local;
  size_t l_local;
  size_t n_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k_local;
  phf *phf_local;
  
  local_178 = n;
  if (n < 2) {
    local_178 = 1;
  }
  l1 = local_178;
  local_180 = l;
  if (l < 2) {
    local_180 = 1;
  }
  a1 = local_180;
  local_188 = a;
  if (99 < a) {
    local_188 = 100;
  }
  if (local_188 < 2) {
    local_198 = 1;
  }
  else {
    local_190 = a;
    if (99 < a) {
      local_190 = 100;
    }
    local_198 = local_190;
  }
  r = local_198;
  B_z = (size_t *)0x0;
  B_p = (phf_key<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
        )0x0;
  T_b = (phf_bits_t *)0x0;
  _error = (void *)0x0;
  i._4_4_ = 0;
  phf->nodiv = true;
  if (local_180 < local_178) {
    local_1a8 = local_180;
  }
  else {
    local_1a8 = local_178;
  }
  n1._4_4_ = seed;
  sStack_38 = a;
  a_local = l;
  l_local = n;
  n_local = (size_t)k;
  k_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)phf;
  m = phf_powerup(local_178 / local_1a8);
  B_k = (phf_key<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
        )phf_powerup((l1 * 100) / r);
  if ((m == 0) ||
     (B_k == (phf_key<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x0)) {
    return 0x22;
  }
  B_z = (size_t *)calloc(l1,0x30);
  if ((B_z != (size_t *)0x0) &&
     (B_p = (phf_key<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)calloc(m,8),
     B_p != (phf_key<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x0)) {
    for (uStack_b8 = 0; uStack_b8 < l_local; uStack_b8 = uStack_b8 + 1) {
      std::__cxx11::string::string((string *)&local_e0,(string *)(n_local + uStack_b8 * 0x20));
      uVar1 = phf_g_mod_r<true,std::__cxx11::string>(&local_e0,n1._4_4_,m);
      std::__cxx11::string::~string((string *)&local_e0);
      local_bc = uVar1;
      std::__cxx11::string::operator=
                ((string *)(B_z + uStack_b8 * 6),(string *)(n_local + uStack_b8 * 0x20));
      *(uint *)(B_z + uStack_b8 * 6 + 4) = local_bc;
      B_z[uStack_b8 * 6 + 5] = (size_t)(&(B_p->k)._M_dataplus + (ulong)local_bc * 8);
      *(long *)B_z[uStack_b8 * 6 + 5] = *(long *)B_z[uStack_b8 * 6 + 5] + 1;
    }
    qsort(B_z,l1,0x30,phf_keycmp<std::__cxx11::string>);
    g = (uint32_t *)((ulong)((long)&B_k[1].k._M_string_length + 7U) >> 6);
    T_b = (phf_bits_t *)calloc((long)g << 1,8);
    if (T_b != (phf_bits_t *)0x0) {
      T_n = (size_t)(T_b + (long)g);
      _error = calloc(m,4);
      if (_error != (void *)0x0) {
        B_pe = (phf_key<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)B_z;
        T = B_z + l_local * 6;
        while( true ) {
          bVar3 = false;
          if (B_pe < T) {
            bVar3 = *B_pe->n != 0;
          }
          if (!bVar3) break;
          _uStack_108 = 0;
LAB_0018a511:
          _uStack_108 = _uStack_108 + 1;
          Bi_pe = B_pe;
          d = (size_t)(B_pe + *B_pe->n);
          for (; Bi_pe < d; Bi_pe = Bi_pe + 1) {
            uVar1 = uStack_108;
            std::__cxx11::string::string((string *)&local_130,(string *)Bi_pe);
            local_10c = phf_f_mod_m<true,std::__cxx11::string>
                                  (uVar1,&local_130,n1._4_4_,(size_t)B_k);
            std::__cxx11::string::~string((string *)&local_130);
            bVar3 = phf_isset(T_b,(ulong)local_10c);
            if ((bVar3) || (bVar3 = phf_isset((phf_bits_t *)T_n,(ulong)local_10c), bVar3))
            goto LAB_0018a5f0;
            phf_setbit((phf_bits_t *)T_n,(ulong)local_10c);
          }
          for (Bi_pe = B_pe; uVar1 = uStack_108, Bi_pe < d; Bi_pe = Bi_pe + 1) {
            std::__cxx11::string::string((string *)&local_170,(string *)Bi_pe);
            local_10c = phf_f_mod_m<true,std::__cxx11::string>
                                  (uVar1,&local_170,n1._4_4_,(size_t)B_k);
            std::__cxx11::string::~string((string *)&local_170);
            phf_setbit(T_b,(ulong)local_10c);
          }
          *(uint32_t *)((long)_error + (ulong)B_pe->g * 4) = uStack_108;
          local_1f8 = uStack_108;
          if (_uStack_108 <= i._4_4_) {
            local_1f8 = i._4_4_;
          }
          i._4_4_ = local_1f8;
          B_pe = B_pe + *B_pe->n;
        }
        *(phf_seed_t *)&k_local->field_0x4 = n1._4_4_;
        k_local->_M_string_length = m;
        (k_local->field_2)._M_allocated_capacity = (size_type)B_k;
        *(void **)((long)&k_local->field_2 + 8) = _error;
        _error = (void *)0x0;
        *(ulong *)(k_local + 1) = (ulong)i._4_4_;
        *(undefined4 *)&k_local[1]._M_string_length = 6;
        k_local[1].field_2._M_allocated_capacity = 0;
        i._0_4_ = 0;
        goto LAB_0018a8cb;
      }
      _error = (void *)0x0;
    }
  }
  piVar2 = __errno_location();
  i._0_4_ = *piVar2;
LAB_0018a8cb:
  free(_error);
  free(T_b);
  free(B_p);
  free(B_z);
  return (int)i;
LAB_0018a5f0:
  for (Bi_pe = B_pe; Bi_pe < d; Bi_pe = Bi_pe + 1) {
    uVar1 = uStack_108;
    std::__cxx11::string::string((string *)&local_150,(string *)Bi_pe);
    local_10c = phf_f_mod_m<true,std::__cxx11::string>(uVar1,&local_150,n1._4_4_,(size_t)B_k);
    std::__cxx11::string::~string((string *)&local_150);
    phf_clrbit((phf_bits_t *)T_n,(ulong)local_10c);
  }
  goto LAB_0018a511;
}

Assistant:

PHF_PUBLIC int PHF::init(struct phf *phf, const key_t k[], const size_t n, const size_t l, const size_t a, const phf_seed_t seed) {
	size_t n1 = PHF_MAX(n, 1); /* for computations that require n > 0 */
	size_t l1 = PHF_MAX(l, 1);
	size_t a1 = PHF_MAX(PHF_MIN(a, 100), 1);
	size_t r; /* number of buckets */
	size_t m; /* size of output array */
	phf_key<key_t> *B_k = NULL; /* linear bucket-slot array */
	size_t *B_z = NULL;         /* number of slots per bucket */
	phf_key<key_t> *B_p, *B_pe;
	phf_bits_t *T = NULL; /* bitmap to track index occupancy */
	phf_bits_t *T_b;      /* per-bucket working bitmap */
	size_t T_n;
	uint32_t *g = NULL; /* displacement map */
	uint32_t d_max = 0; /* maximum displacement value */
	int error;

	if ((phf->nodiv = nodiv)) {
		/* round to power-of-2 so we can use bit masks instead of modulo division */
		r = phf_powerup(n1 / PHF_MIN(l1, n1));
		m = phf_powerup((n1 * 100) / a1);
	} else {
		r = phf_primeup(PHF_HOWMANY(n1, l1));
		/* XXX: should we bother rounding m to prime number for small n? */
		m = phf_primeup((n1 * 100) / a1);
	}

	if (r == 0 || m == 0)
		return ERANGE;

	if (!(B_k = static_cast<phf_key<key_t> *>(calloc(n1, sizeof *B_k))))
		goto syerr;
	if (!(B_z = static_cast<size_t *>(calloc(r, sizeof *B_z))))
		goto syerr;

	for (size_t i = 0; i < n; i++) {
		phf_hash_t g = phf_g_mod_r<nodiv>(k[i], seed, r);

		B_k[i].k = k[i];
		B_k[i].g = g;
		B_k[i].n = &B_z[g];
		++*B_k[i].n;
	}

	qsort(B_k, n1, sizeof *B_k, reinterpret_cast<int(*)(const void *, const void *)>(&phf_keycmp<key_t>));

	T_n = PHF_HOWMANY(m, PHF_BITS(*T));
	if (!(T = static_cast<phf_bits_t *>(calloc(T_n * 2, sizeof *T))))
		goto syerr;
	T_b = &T[T_n]; /* share single allocation */

	/*
	 * FIXME: T_b[] is unnecessary. We could clear T[] the same way we
	 * clear T_b[]. In fact, at the end of generation T_b[] is identical
	 * to T[] because we don't clear T_b[] on success.
	 *
	 * We just need to tweak the current reset logic to stop before the
	 * key that failed, and then we can elide the commit to T[] at the
	 * end of the outer loop.
	 */

	if (!(g = static_cast<uint32_t *>(calloc(r, sizeof *g))))
		goto syerr;

	B_p = B_k;
	B_pe = &B_k[n];

	for (; B_p < B_pe && *B_p->n > 0; B_p += *B_p->n) {
		phf_key<key_t> *Bi_p, *Bi_pe;
		size_t d = 0;
		uint32_t f;
retry:
		d++;
		Bi_p = B_p;
		Bi_pe = B_p + *B_p->n;

		for (; Bi_p < Bi_pe; Bi_p++) {
			f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);

			if (phf_isset(T, f) || phf_isset(T_b, f)) {
				/* reset T_b[] */
				for (Bi_p = B_p; Bi_p < Bi_pe; Bi_p++) {
					f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);
					phf_clrbit(T_b, f);
				}

				goto retry;
			} else {
				phf_setbit(T_b, f);
			}
		}

		/* commit to T[] */
		for (Bi_p = B_p; Bi_p < Bi_pe; Bi_p++) {
			f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);
			phf_setbit(T, f);
		}

		/* commit to g[] */
		g[B_p->g] = d;
		d_max = PHF_MAX(d, d_max);
	}

	phf->seed = seed;
	phf->r = r;
	phf->m = m;

	phf->g = g;
	g = NULL;

	phf->d_max = d_max;
	phf->g_op = (nodiv)? phf::PHF_G_UINT32_BAND_R : phf::PHF_G_UINT32_MOD_R;
	phf->g_jmp = NULL;

	error = 0;

	goto clean;
syerr:
	error = errno;
clean:
	free(g);
	free(T);
	free(B_z);
	free(B_k);

	return error;
}